

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::unpack_expression_type
          (CompilerGLSL *this,string *expr_str,SPIRType *param_2,uint32_t param_3,bool param_4,
          bool param_5)

{
  bool param_5_local;
  bool param_4_local;
  uint32_t param_3_local;
  SPIRType *param_2_local;
  string *expr_str_local;
  CompilerGLSL *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)param_2);
  return this;
}

Assistant:

string CompilerGLSL::unpack_expression_type(string expr_str, const SPIRType &, uint32_t, bool, bool)
{
	return expr_str;
}